

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testMajorAxis<Imath_3_2::Vec2<short>>(char *type)

{
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  Box<Imath_3_2::Vec2<short>_> *this;
  Box<Imath_3_2::Vec2<short>_> *pBVar4;
  short *psVar5;
  char *in_RDI;
  Box<Imath_3_2::Vec2<short>_> b_2;
  Vec2<short> max;
  uint j_1;
  uint i_1;
  uint j;
  Vec2<short> size;
  uint major;
  Box<Imath_3_2::Vec2<short>_> b_1;
  uint i;
  vector<Imath_3_2::Vec2<short>,_std::allocator<Imath_3_2::Vec2<short>_>_> perms;
  Box<Imath_3_2::Vec2<short>_> b;
  int in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  reference in_stack_ffffffffffffff78;
  Vec2<short> local_6c [3];
  Vec2<short> local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  vector<Imath_3_2::Vec2<short>,_std::allocator<Imath_3_2::Vec2<short>_>_>
  *in_stack_ffffffffffffffb0;
  uint local_48;
  Vec2<short> local_44 [3];
  uint local_38;
  vector<Imath_3_2::Vec2<short>,_std::allocator<Imath_3_2::Vec2<short>_>_> local_28;
  char *local_8;
  
  local_8 = in_RDI;
  poVar3 = std::operator<<((ostream *)&std::cout,"    majorAxis() for type ");
  poVar3 = std::operator<<(poVar3,local_8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Box<Imath_3_2::Vec2<short>_>::Box
            ((Box<Imath_3_2::Vec2<short>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  uVar1 = Imath_3_2::Box<Imath_3_2::Vec2<short>_>::majorAxis
                    ((Box<Imath_3_2::Vec2<short>_> *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if (uVar1 != 0) {
    __assert_fail("b.majorAxis () == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x38f,
                  "void (anonymous namespace)::testMajorAxis(const char *) [T = Imath_3_2::Vec2<short>]"
                 );
  }
  std::vector<Imath_3_2::Vec2<short>,_std::allocator<Imath_3_2::Vec2<short>_>_>::vector
            ((vector<Imath_3_2::Vec2<short>,_std::allocator<Imath_3_2::Vec2<short>_>_> *)0x12cb90);
  permutations<Imath_3_2::Vec2<short>>(in_stack_ffffffffffffffb0);
  local_38 = 0;
  while( true ) {
    this = (Box<Imath_3_2::Vec2<short>_> *)(ulong)local_38;
    pBVar4 = (Box<Imath_3_2::Vec2<short>_> *)
             std::vector<Imath_3_2::Vec2<short>,_std::allocator<Imath_3_2::Vec2<short>_>_>::size
                       (&local_28);
    if (pBVar4 <= this) {
      std::vector<Imath_3_2::Vec2<short>,_std::allocator<Imath_3_2::Vec2<short>_>_>::~vector
                ((vector<Imath_3_2::Vec2<short>,_std::allocator<Imath_3_2::Vec2<short>_>_> *)this);
      local_58 = 0;
      do {
        uVar1 = local_58;
        uVar2 = Imath_3_2::Vec2<short>::dimensions();
        if (uVar2 <= uVar1) {
          return;
        }
        local_5c = 0;
        while( true ) {
          uVar1 = local_5c;
          uVar2 = Imath_3_2::Vec2<short>::dimensions();
          if (uVar2 <= uVar1) break;
          Imath_3_2::Vec2<short>::Vec2(&local_60,0);
          psVar5 = Imath_3_2::Vec2<short>::operator[](&local_60,local_5c);
          *psVar5 = 1;
          Imath_3_2::Vec2<short>::Vec2(local_6c,0);
          Imath_3_2::Box<Imath_3_2::Vec2<short>_>::Box
                    (this,in_stack_ffffffffffffff78,
                     (Vec2<short> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
          uVar1 = Imath_3_2::Box<Imath_3_2::Vec2<short>_>::majorAxis
                            ((Box<Imath_3_2::Vec2<short>_> *)
                             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
          if (uVar1 != local_5c) {
            __assert_fail("b.majorAxis () == j",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                          ,0x3bc,
                          "void (anonymous namespace)::testMajorAxis(const char *) [T = Imath_3_2::Vec2<short>]"
                         );
          }
          local_5c = local_5c + 1;
        }
        local_58 = local_58 + 1;
      } while( true );
    }
    Imath_3_2::Vec2<short>::Vec2(local_44,0);
    std::vector<Imath_3_2::Vec2<short>,_std::allocator<Imath_3_2::Vec2<short>_>_>::operator[]
              (&local_28,(ulong)local_38);
    Imath_3_2::Box<Imath_3_2::Vec2<short>_>::Box
              (this,in_stack_ffffffffffffff78,
               (Vec2<short> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    local_48 = 0;
    in_stack_ffffffffffffff78 =
         std::vector<Imath_3_2::Vec2<short>,_std::allocator<Imath_3_2::Vec2<short>_>_>::operator[]
                   (&local_28,(ulong)local_38);
    Imath_3_2::Vec2<short>::Vec2((Vec2<short> *)&stack0xffffffffffffffb0,0);
    Imath_3_2::Vec2<short>::operator-
              (in_stack_ffffffffffffff78,
               (Vec2<short> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    local_54 = 1;
    while( true ) {
      in_stack_ffffffffffffff74 = local_54;
      uVar1 = Imath_3_2::Vec2<short>::dimensions();
      if (uVar1 <= in_stack_ffffffffffffff74) break;
      psVar5 = Imath_3_2::Vec2<short>::operator[]((Vec2<short> *)&stack0xffffffffffffffb4,local_54);
      in_stack_ffffffffffffff70 = (int)*psVar5;
      psVar5 = Imath_3_2::Vec2<short>::operator[]((Vec2<short> *)&stack0xffffffffffffffb4,local_48);
      if (*psVar5 < in_stack_ffffffffffffff70) {
        local_48 = local_54;
      }
      local_54 = local_54 + 1;
    }
    uVar1 = Imath_3_2::Box<Imath_3_2::Vec2<short>_>::majorAxis
                      ((Box<Imath_3_2::Vec2<short>_> *)
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    if (uVar1 != local_48) break;
    local_38 = local_38 + 1;
  }
  __assert_fail("b.majorAxis () == major",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                ,0x3a3,
                "void (anonymous namespace)::testMajorAxis(const char *) [T = Imath_3_2::Vec2<short>]"
               );
}

Assistant:

void
testMajorAxis (const char* type)
{
    cout << "    majorAxis() for type " << type << endl;

    //
    // Empty box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        assert (b.majorAxis () == 0);
    }

    //
    // Non-empty, has-volume box.
    // Boxes are [ (0, 0, ...), (<all permutations of 1..T::dimensions()>) ]
    //
    {
        std::vector<T> perms;
        permutations (perms);

        for (unsigned int i = 0; i < perms.size (); i++)
        {
            IMATH_INTERNAL_NAMESPACE::Box<T> b (T (0), perms[i]);

            unsigned int major = 0;
            T            size  = perms[i] - T (0);
            for (unsigned int j = 1; j < T::dimensions (); j++)
                if (size[j] > size[major]) major = j;

            assert (b.majorAxis () == major);
        }
    }

    //
    // Non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0), (1, 0) ]
    //    2D: [(0, 0), (0, 1) ]
    //
    //    3D: [(0, 0), (1, 0, 0) ]
    //    3D: [(0, 0), (0, 1, 0) ]
    //    3D: [(0, 0), (0, 0, 1) ]
    //
    //    and similarly for 4D
    //
    {
        for (unsigned int i = 0; i < T::dimensions (); i++)
        {
            for (unsigned int j = 0; j < T::dimensions (); j++)
            {
                T max (0);
                max[j] = 1;

                IMATH_INTERNAL_NAMESPACE::Box<T> b (T (0), max);
                assert (b.majorAxis () == j);
            }
        }
    }
}